

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O3

int SetAllPWMsPololu(POLOLU *pPololu,int *selectedchannels,int *pws)

{
  ssize_t sVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  int pws_tmp [24];
  uchar sendbuf [512];
  uint local_298 [24];
  byte local_238 [520];
  
  bVar12 = 0;
  iVar9 = 0;
  memset(local_238,0,0x200);
  if (pPololu->bEnableSetMultipleTargets == 0) {
    puVar7 = local_298;
    for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *pws;
      pws = pws + (ulong)bVar12 * -2 + 1;
      puVar7 = (uint *)((int *)puVar7 + (ulong)bVar12 * -2 + 1);
    }
    lVar3 = 0;
    iVar9 = 0;
    iVar4 = 0;
    do {
      if (selectedchannels[lVar3] != 0) {
        iVar2 = (int)((double)(int)(local_298[lVar3] - 0x5dc) * pPololu->CoefPWs[lVar3]);
        if (pPololu->bProportionalPWs[lVar3] == 0) {
          uVar6 = iVar2 + 0x5dc;
        }
        else {
          iVar5 = pPololu->MidPWs[lVar3];
          if (iVar2 < 0) {
            iVar2 = (int)((ulong)((long)((pPololu->MinPWs[lVar3] - iVar5) * iVar2) * -0x10624dd3) >>
                         0x20);
          }
          else {
            iVar2 = (int)((ulong)((long)((pPololu->MaxPWs[lVar3] - iVar5) * iVar2) * 0x10624dd3) >>
                         0x20);
          }
          uVar6 = ((iVar2 >> 5) - (iVar2 >> 0x1f)) + iVar5;
        }
        if (pPololu->MaxPWs[lVar3] <= (int)uVar6) {
          uVar6 = pPololu->MaxPWs[lVar3];
        }
        if ((int)uVar6 <= pPololu->MinPWs[lVar3]) {
          uVar6 = pPololu->MinPWs[lVar3];
        }
        local_298[lVar3] = uVar6;
        iVar5 = uVar6 - pPololu->LastPWs[lVar3];
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        if (pPololu->ThresholdPWs[lVar3] <= iVar2) {
          local_238[iVar4] = 0xaa;
          local_238[(long)iVar4 + 1] = (byte)pPololu->DeviceNumber;
          local_238[(long)iVar4 + 2] = 4;
          local_238[(long)iVar4 + 3] = (byte)lVar3;
          local_238[(long)iVar4 + 4] = (char)uVar6 * '\x04' & 0x7c;
          local_238[(long)iVar4 + 5] = (byte)(uVar6 >> 5) & 0x7f;
          iVar9 = iVar9 + 1;
          iVar4 = iVar4 + 6;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18);
    if (iVar9 == 0) {
      return 0;
    }
    uVar6 = iVar9 * 6;
  }
  else {
    local_238[0] = 0xaa;
    local_238[1] = (byte)pPololu->DeviceNumber;
    local_238[2] = 0x1f;
    puVar7 = local_298;
    for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *pws;
      pws = pws + (ulong)bVar12 * -2 + 1;
      puVar7 = (uint *)((int *)puVar7 + (ulong)bVar12 * -2 + 1);
    }
    iVar2 = 5;
    iVar4 = 0x18;
    lVar3 = 0;
    do {
      if (selectedchannels[lVar3] != 0) {
        if (iVar9 + iVar4 < lVar3) {
          puts("Pololu multiple channels must be continuous.");
          return 1;
        }
        iVar5 = (int)((double)(int)(local_298[lVar3] - 0x5dc) * pPololu->CoefPWs[lVar3]);
        if (pPololu->bProportionalPWs[lVar3] == 0) {
          uVar6 = iVar5 + 0x5dc;
        }
        else {
          iVar8 = pPololu->MidPWs[lVar3];
          if (iVar5 < 0) {
            iVar5 = (int)((ulong)((long)((pPololu->MinPWs[lVar3] - iVar8) * iVar5) * -0x10624dd3) >>
                         0x20);
          }
          else {
            iVar5 = (int)((ulong)((long)((pPololu->MaxPWs[lVar3] - iVar8) * iVar5) * 0x10624dd3) >>
                         0x20);
          }
          uVar6 = ((iVar5 >> 5) - (iVar5 >> 0x1f)) + iVar8;
        }
        if (pPololu->MaxPWs[lVar3] <= (int)uVar6) {
          uVar6 = pPololu->MaxPWs[lVar3];
        }
        if ((int)uVar6 <= pPololu->MinPWs[lVar3]) {
          uVar6 = pPololu->MinPWs[lVar3];
        }
        iVar8 = uVar6 - pPololu->LastPWs[lVar3];
        iVar5 = -iVar8;
        if (0 < iVar8) {
          iVar5 = iVar8;
        }
        uVar10 = pPololu->LastPWs[lVar3];
        if (pPololu->ThresholdPWs[lVar3] <= iVar5) {
          uVar10 = uVar6;
        }
        local_298[lVar3] = uVar10;
        local_238[iVar2] = (char)uVar10 * '\x04' & 0x7c;
        local_238[(long)iVar2 + 1] = (byte)(uVar10 >> 5) & 0x7f;
        if ((int)lVar3 < iVar4) {
          iVar4 = (int)lVar3;
        }
        iVar9 = iVar9 + 1;
        iVar2 = iVar2 + 2;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18);
    if (iVar9 == 0) {
      return 0;
    }
    local_238[3] = (byte)iVar9;
    local_238[4] = (byte)iVar4;
    uVar6 = iVar9 * 2 + 5;
  }
  iVar9 = (pPololu->RS232Port).DevType;
  if (iVar9 - 1U < 4) {
    if (0 < (int)uVar6) {
      iVar9 = (pPololu->RS232Port).s;
      uVar11 = 0;
      do {
        sVar1 = send(iVar9,local_238 + uVar11,(long)(int)(uVar6 - (int)uVar11),0);
        if ((int)sVar1 < 1) {
          return 1;
        }
        uVar10 = (int)uVar11 + (int)sVar1;
        uVar11 = (ulong)uVar10;
      } while ((int)uVar10 < (int)uVar6);
    }
  }
  else {
    if (iVar9 != 0) {
      return 1;
    }
    iVar9 = *(int *)&(pPololu->RS232Port).hDev;
    uVar11 = 0;
    do {
      sVar1 = write(iVar9,local_238 + uVar11,(ulong)(uVar6 - (int)uVar11));
      if ((int)sVar1 < 1) {
        return 1;
      }
      uVar10 = (int)uVar11 + (int)sVar1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 < uVar6);
  }
  if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_238,(long)(int)uVar6,1,(FILE *)pPololu->pfSaveFile);
    fflush((FILE *)pPololu->pfSaveFile);
  }
  lVar3 = 0;
  do {
    if (selectedchannels[lVar3] != 0) {
      iVar4 = local_298[lVar3] - pPololu->LastPWs[lVar3];
      iVar9 = -iVar4;
      if (0 < iVar4) {
        iVar9 = iVar4;
      }
      if (pPololu->ThresholdPWs[lVar3] <= iVar9) {
        pPololu->LastPWs[lVar3] = local_298[lVar3];
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x18);
  return 0;
}

Assistant:

inline int SetAllPWMsPololu(POLOLU* pPololu, int* selectedchannels, int* pws)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int channel = 0;
	int target = 0;
	int pws_tmp[NB_CHANNELS_PWM_POLOLU];
	int index = 0, firstselectedchannel = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	if (pPololu->bEnableSetMultipleTargets)
	{
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[2] = (unsigned char)(SET_MULTIPLE_TARGETS_COMMAND_POLOLU & 0x7F);

		firstselectedchannel = NB_CHANNELS_PWM_POLOLU;
		nbselectedchannels = 0;
		index = 5;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			// To check...
			if (channel > firstselectedchannel+nbselectedchannels)
			{
				printf("Pololu multiple channels must be continuous.\n");
				return EXIT_FAILURE;
			}

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) pws_tmp[channel] = pPololu->LastPWs[channel];

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			target = pws_tmp[channel]*4;
			sendbuf[index] = (unsigned char)(target & 0x7F);
			sendbuf[index+1] = (unsigned char)((target >> 7) & 0x7F);

			firstselectedchannel = min(channel, firstselectedchannel);
			nbselectedchannels++;
			index += 2;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuf[3] = (unsigned char)nbselectedchannels;
		sendbuf[4] = (unsigned char)firstselectedchannel;

		sendbuflen = 5+2*nbselectedchannels;
	}
	else
	{
		nbselectedchannels = 0;
		index = 0;

		memcpy(pws_tmp, pws, sizeof(pws_tmp));

		for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
		{
			if (!selectedchannels[channel]) continue;

			if (pPololu->bProportionalPWs[channel])
			{
				pws_tmp[channel] = (int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
				if (pws_tmp[channel] >= 0)
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
				else
					pws_tmp[channel] = pPololu->MidPWs[channel]+pws_tmp[channel]*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
					/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
			}
			else
			{
				pws_tmp[channel] = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_POLOLU));
			}

			pws_tmp[channel] = max(min(pws_tmp[channel], pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
			//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

			// The requested PWM is only applied if it is slightly different from the current value.
			if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

			//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pPololu->LastPWs[channel], abs(pws_tmp[channel]-pPololu->LastPWs[channel]), pPololu->ThresholdPWs[channel]);

			sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
			sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
			sendbuf[index+2] = (unsigned char)(SET_TARGET_COMMAND_POLOLU & 0x7F);
			sendbuf[index+3] = (unsigned char)channel;
			target = pws_tmp[channel]*4;
			sendbuf[index+4] = (unsigned char)(target & 0x7F);
			sendbuf[index+5] = (unsigned char)((target >> 7) & 0x7F);

			nbselectedchannels++;
			index += 6;
		}

		if (nbselectedchannels == 0) return EXIT_SUCCESS;

		sendbuflen = 6*nbselectedchannels;
	}

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) continue;

		// Update last known value.
		pPololu->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}